

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O1

void ncnn::conv_im2col_sgemm_int8_dequant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,int kernel_w,int kernel_h,int stride_w,
               int stride_h,Mat *_bias,vector<float,_std::allocator<float>_> *scale_dequant,
               Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  size_t sVar5;
  size_t sVar6;
  pointer pfVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [14];
  undefined1 auVar27 [14];
  unkbyte10 Var28;
  uint uVar29;
  ulong uVar31;
  void *pvVar32;
  ulong *puVar33;
  uint uVar34;
  int iVar35;
  int iVar36;
  uint uVar37;
  uint uVar38;
  long lVar39;
  void *pvVar40;
  float *pfVar41;
  int iVar42;
  ulong uVar43;
  void *pvVar44;
  float *pfVar45;
  int n_1;
  int iVar46;
  long lVar47;
  long lVar48;
  int iVar49;
  void *pvVar50;
  int iVar51;
  uint uVar52;
  float *pfVar53;
  long lVar54;
  undefined1 *puVar55;
  void *pvVar56;
  char *pcVar57;
  int iVar58;
  long lVar59;
  void *pvVar60;
  ulong uVar61;
  int p;
  float *pfVar62;
  undefined1 *puVar63;
  char *pcVar64;
  char *pcVar65;
  int iVar66;
  uint uVar67;
  char *ret;
  void *__ptr;
  int iVar68;
  size_t totalsize;
  void *pvVar69;
  short sVar70;
  short sVar79;
  short sVar80;
  short sVar81;
  undefined1 auVar71 [12];
  undefined1 auVar72 [12];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  short sVar82;
  short sVar85;
  short sVar86;
  short sVar87;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  short sVar88;
  short sVar89;
  short sVar90;
  short sVar91;
  float fVar92;
  short sVar95;
  float fVar93;
  short sVar96;
  short sVar97;
  undefined1 auVar94 [16];
  float fVar98;
  short sVar99;
  short sVar101;
  undefined1 auVar100 [16];
  float fVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  short sVar113;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  void *ptr_1;
  Mat bottom_tm;
  int sum3 [4];
  int sum2 [4];
  int sum1 [4];
  undefined1 local_158 [16];
  ulong local_140;
  void *local_138;
  ulong local_130;
  ulong local_128;
  void *local_120;
  void *local_118;
  undefined8 uStack_110;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  Allocator *local_f8;
  undefined1 auStack_f0 [16];
  ulong uStack_e0;
  int *local_d8;
  Allocator *local_d0;
  ulong local_c8;
  void *local_c0;
  ulong local_b8;
  ulong local_b0;
  float local_a8;
  float local_a4;
  int *local_a0;
  Mat *local_98;
  ulong local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  Allocator *local_50;
  long local_48;
  void *local_40;
  pointer local_38;
  ulong uVar30;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar74 [16];
  undefined1 auVar78 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  
  uVar52 = bottom_blob->c;
  iVar42 = top_blob->h;
  local_120 = _kernel->data;
  local_c0 = _bias->data;
  uVar34 = uVar52 * kernel_h * kernel_w;
  local_130 = CONCAT44(local_130._4_4_,top_blob->w);
  uVar29 = iVar42 * top_blob->w;
  uVar30 = (ulong)uVar29;
  uVar38 = bottom_blob->w;
  local_128 = (ulong)top_blob->c;
  local_d0 = opt->workspace_allocator;
  local_98 = top_blob;
  if (uVar29 * uVar34 == 0) {
    local_d8 = (int *)0x0;
    __ptr = (void *)0x0;
  }
  else {
    uVar31 = (long)(int)(uVar29 * uVar34) + 3U & 0xfffffffffffffffc;
    if (local_d0 == (Allocator *)0x0) {
      local_118 = (void *)0x0;
      iVar36 = posix_memalign(&local_118,0x10,uVar31 + 4);
      if (iVar36 != 0) {
        local_118 = (void *)0x0;
      }
    }
    else {
      local_118 = (void *)(**(code **)(*(long *)local_d0 + 0x10))();
    }
    local_d8 = (int *)((long)local_118 + uVar31);
    *(undefined4 *)((long)local_118 + uVar31) = 1;
    __ptr = local_118;
  }
  if (0 < iVar42) {
    local_b0 = (ulong)(stride_h * uVar38);
    iVar51 = 0;
    iVar36 = 0;
    lVar54 = 0;
    do {
      local_138 = (void *)lVar54;
      if (0 < (int)local_130) {
        iVar35 = 0;
        lVar54 = (long)local_138;
        do {
          if (0 < (int)uVar52) {
            uVar31 = 0;
            do {
              if (0 < kernel_h) {
                sVar5 = bottom_blob->cstep;
                sVar6 = bottom_blob->elemsize;
                pvVar60 = bottom_blob->data;
                iVar49 = 0;
                lVar59 = lVar54;
                do {
                  if (0 < kernel_w) {
                    uVar43 = 0;
                    do {
                      *(undefined1 *)((long)__ptr + uVar43 + (long)iVar51) =
                           *(undefined1 *)
                            ((long)pvVar60 +
                            (long)((int)lVar59 + (int)uVar43) + sVar5 * uVar31 * sVar6);
                      uVar43 = uVar43 + 1;
                    } while ((uint)kernel_w != uVar43);
                    iVar51 = iVar51 + (int)uVar43;
                  }
                  iVar49 = iVar49 + 1;
                  lVar59 = lVar59 + (ulong)uVar38;
                } while (iVar49 != kernel_h);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar52);
          }
          iVar35 = iVar35 + 1;
          lVar54 = lVar54 + (ulong)(uint)stride_w;
        } while (iVar35 != (int)local_130);
      }
      iVar36 = iVar36 + 1;
      lVar54 = (long)local_138 + local_b0;
    } while (iVar36 != iVar42);
  }
  iVar42 = kernel_h * kernel_w * 4;
  uVar38 = uVar29 + 3;
  if (-1 < (int)uVar29) {
    uVar38 = uVar29;
  }
  auStack_f0._12_4_ = uVar29 + ((int)uVar38 >> 2) * -3;
  local_f8 = opt->workspace_allocator;
  auVar107._4_4_ = -(uint)(uVar52 == 0);
  auVar107._0_4_ = -(uint)(iVar42 == 0);
  auVar107._8_4_ = -(uint)(auStack_f0._12_4_ == 0);
  auVar107._12_4_ = 0;
  movmskps((int)auStack_f0,auVar107 << 0x20);
  local_118 = (void *)0x0;
  uStack_110._0_4_ = 0;
  uStack_110._4_4_ = 0;
  uStack_110 = (int *)0x0;
  uStack_108 = 1;
  uStack_104 = 0;
  uStack_100 = 1;
  auStack_f0._4_4_ = iVar42;
  auStack_f0._0_4_ = 3;
  auStack_f0._8_4_ = uVar52;
  uStack_e0 = (long)(int)(uVar52 * iVar42) + 0xfU & 0xfffffffffffffff0;
  uVar31 = (long)(int)auStack_f0._12_4_ * uStack_e0;
  if (uVar31 != 0) {
    if (local_f8 == (Allocator *)0x0) {
      auVar114._8_8_ = 0;
      auVar114._0_8_ = local_158._8_8_;
      local_158 = auVar114 << 0x40;
      iVar36 = posix_memalign((void **)local_158,0x10,uVar31 | 4);
      if (iVar36 != 0) {
        auVar94._8_8_ = 0;
        auVar94._0_8_ = local_158._8_8_;
        local_158 = auVar94 << 0x40;
      }
      local_118 = (void *)local_158._0_8_;
    }
    else {
      local_118 = (void *)(**(code **)(*(long *)local_f8 + 0x10))(local_f8);
    }
    uStack_110 = (int *)((long)local_118 + uVar31);
    *(undefined4 *)((long)local_118 + uVar31) = 1;
  }
  local_138 = (void *)(long)(int)uVar34;
  if (0 < (int)uVar29 >> 2) {
    local_130 = (ulong)(uint)((int)uVar29 >> 2);
    lVar59 = (long)local_138 * 4;
    lVar54 = (long)__ptr + (long)local_138;
    pvVar56 = (void *)((long)local_138 * 3 + (long)__ptr);
    pvVar60 = (void *)((long)__ptr + (long)local_138 * 2);
    uVar31 = 0;
    pvVar69 = __ptr;
    do {
      puVar63 = (undefined1 *)
                (uStack_e0 * uVar31 * CONCAT44(uStack_104,uStack_108) + (long)local_118);
      if ((int)uVar34 < 2) {
        pvVar44 = (void *)(uVar31 * 4 * (long)local_138 + (long)__ptr);
        pvVar50 = (void *)((uVar31 * 4 + 1) * (long)local_138 + (long)__ptr);
        pvVar40 = (void *)((uVar31 * 4 + 2) * (long)local_138 + (long)__ptr);
        pvVar32 = (void *)((uVar31 * 4 + 3) * (long)local_138 + (long)__ptr);
        uVar38 = 0;
      }
      else {
        lVar47 = 0;
        do {
          puVar55 = puVar63;
          puVar63 = (undefined1 *)
                    ((long)local_118 +
                    lVar47 * 4 + uStack_e0 * CONCAT44(uStack_104,uStack_108) * uVar31);
          *puVar63 = *(undefined1 *)((long)pvVar69 + lVar47);
          puVar63[1] = *(undefined1 *)((long)pvVar69 + lVar47 + 1);
          puVar63[2] = *(undefined1 *)(lVar54 + lVar47);
          puVar63[3] = *(undefined1 *)(lVar54 + 1 + lVar47);
          puVar63[4] = *(undefined1 *)((long)pvVar60 + lVar47);
          puVar63[5] = *(undefined1 *)((long)pvVar60 + lVar47 + 1);
          puVar63[6] = *(undefined1 *)((long)pvVar56 + lVar47);
          puVar63[7] = *(undefined1 *)((long)pvVar56 + lVar47 + 1);
          lVar39 = lVar47 + 2;
          iVar36 = (int)lVar47;
          lVar47 = lVar39;
          puVar63 = puVar63 + 8;
        } while (iVar36 + 3 < (int)uVar34);
        puVar63 = puVar55 + 8;
        pvVar44 = (void *)((long)pvVar69 + lVar39);
        pvVar50 = (void *)(lVar54 + lVar39);
        pvVar32 = (void *)((long)pvVar56 + lVar39);
        pvVar40 = (void *)(lVar39 + (long)pvVar60);
        uVar38 = uVar34 & 0xfffffffe;
      }
      if ((int)uVar38 < (int)uVar34) {
        lVar47 = 0;
        do {
          puVar63[lVar47 * 4] = *(undefined1 *)((long)pvVar44 + lVar47);
          puVar63[lVar47 * 4 + 1] = *(undefined1 *)((long)pvVar50 + lVar47);
          puVar63[lVar47 * 4 + 2] = *(undefined1 *)((long)pvVar40 + lVar47);
          puVar63[lVar47 * 4 + 3] = *(undefined1 *)((long)pvVar32 + lVar47);
          lVar47 = lVar47 + 1;
        } while (uVar34 - uVar38 != (int)lVar47);
      }
      uVar31 = uVar31 + 1;
      pvVar69 = (void *)((long)pvVar69 + lVar59);
      lVar54 = lVar54 + lVar59;
      pvVar56 = (void *)((long)pvVar56 + lVar59);
      pvVar60 = (void *)((long)pvVar60 + lVar59);
    } while (uVar31 != local_130);
  }
  if ((uVar29 & 0xfffffffc) != uVar29) {
    lVar54 = (long)(int)(uVar29 & 0xfffffffc);
    do {
      puVar63 = (undefined1 *)(lVar54 * (long)local_138 + (long)__ptr);
      uVar38 = (uint)lVar54;
      uVar67 = uVar38 + 3;
      if (-1 < (int)uVar38) {
        uVar67 = uVar38;
      }
      puVar55 = (undefined1 *)
                ((long)(int)(((int)uVar67 >> 2) + (uVar38 - (uVar67 & 0xfffffffc))) * uStack_e0 *
                 CONCAT44(uStack_104,uStack_108) + (long)local_118);
      if ((int)uVar34 < 2) {
        uVar38 = 0;
      }
      else {
        iVar36 = 1;
        do {
          *puVar55 = *puVar63;
          puVar55[1] = puVar63[1];
          puVar55 = puVar55 + 2;
          puVar63 = puVar63 + 2;
          iVar36 = iVar36 + 2;
          uVar38 = uVar34 & 0xfffffffe;
        } while (iVar36 < (int)uVar34);
      }
      if ((int)uVar38 < (int)uVar34) {
        lVar59 = 0;
        do {
          puVar55[lVar59] = puVar63[lVar59];
          lVar59 = lVar59 + 1;
        } while (uVar34 - uVar38 != (int)lVar59);
      }
      lVar54 = lVar54 + 1;
    } while (lVar54 < (int)uVar29);
  }
  uVar38 = (uint)local_128;
  uVar67 = uVar38 + 3;
  if (-1 < (int)uVar38) {
    uVar67 = uVar38;
  }
  uVar37 = uVar38 + 3;
  if (-1 < (int)uVar38) {
    uVar37 = uVar38;
  }
  local_50 = opt->workspace_allocator;
  iVar42 = iVar42 * uVar52;
  local_140 = (long)iVar42 + 0xfU & 0xfffffffffffffff0;
  uVar31 = (long)(int)((uVar38 - (uVar37 & 0xfffffffc)) + ((int)uVar67 >> 2)) * local_140;
  if (uVar31 == 0) {
    local_a0 = (int *)0x0;
    pvVar60 = (void *)0x0;
  }
  else {
    if (local_50 == (Allocator *)0x0) {
      auVar115._8_8_ = 0;
      auVar115._0_8_ = local_158._8_8_;
      local_158 = auVar115 << 0x40;
      iVar36 = posix_memalign((void **)local_158,0x10,uVar31 | 4);
      if (iVar36 != 0) {
        auVar100._8_8_ = 0;
        auVar100._0_8_ = local_158._8_8_;
        local_158 = auVar100 << 0x40;
      }
      pvVar60 = (void *)local_158._0_8_;
    }
    else {
      pvVar60 = (void *)(**(code **)(*(long *)local_50 + 0x10))(local_50);
    }
    local_a0 = (int *)((long)pvVar60 + uVar31);
    *(undefined4 *)((long)pvVar60 + uVar31) = 1;
  }
  iVar36 = (int)local_128;
  uVar38 = iVar36 >> 2;
  local_c8 = local_128 & 0xfffffffffffffffc;
  local_90 = (ulong)uVar38;
  if (0 < (int)uVar38) {
    iVar35 = uVar52 * kernel_h * kernel_w;
    iVar51 = iVar35 * 3;
    iVar35 = iVar35 * 2;
    iVar49 = 0;
    uVar31 = 0;
    pvVar69 = pvVar60;
    uVar52 = uVar34;
    do {
      puVar63 = (undefined1 *)(local_140 * uVar31 + (long)pvVar60);
      if ((int)uVar34 < 2) {
        iVar58 = (int)uVar31;
        lVar54 = (long)(int)((iVar58 * 4 + 3) * uVar34);
        lVar59 = (long)(int)((iVar58 * 4 + 2) * uVar34);
        lVar47 = (long)(int)((iVar58 * 4 + 1) * uVar34);
        lVar39 = (long)(int)(iVar58 * 4 * uVar34);
        uVar67 = 0;
      }
      else {
        lVar54 = 0;
        do {
          puVar55 = puVar63;
          puVar63 = (undefined1 *)((long)pvVar69 + lVar54 * 4);
          *puVar63 = *(undefined1 *)((long)local_120 + lVar54 + iVar49);
          puVar63[1] = *(undefined1 *)((long)local_120 + lVar54 + (long)iVar49 + 1);
          puVar63[2] = *(undefined1 *)((long)local_120 + lVar54 + (int)uVar52);
          puVar63[3] = *(undefined1 *)((long)local_120 + lVar54 + (long)(int)uVar52 + 1);
          puVar63[4] = *(undefined1 *)((long)local_120 + lVar54 + iVar35);
          puVar63[5] = *(undefined1 *)((long)local_120 + lVar54 + (long)iVar35 + 1);
          puVar63[6] = *(undefined1 *)((long)local_120 + lVar54 + iVar51);
          puVar63[7] = *(undefined1 *)((long)local_120 + lVar54 + (long)iVar51 + 1);
          lVar39 = lVar54 + 2;
          iVar58 = (int)lVar54;
          lVar54 = lVar39;
          puVar63 = puVar63 + 8;
        } while (iVar58 + 3 < (int)uVar34);
        puVar63 = puVar55 + 8;
        lVar54 = lVar39 + iVar51;
        lVar59 = lVar39 + iVar35;
        lVar47 = lVar39 + (int)uVar52;
        lVar39 = lVar39 + iVar49;
        uVar67 = uVar34 & 0xfffffffe;
      }
      if ((int)uVar67 < (int)uVar34) {
        lVar48 = 0;
        do {
          puVar63[lVar48 * 4] = *(undefined1 *)((long)local_120 + lVar48 + lVar39);
          puVar63[lVar48 * 4 + 1] = *(undefined1 *)((long)local_120 + lVar48 + lVar47);
          puVar63[lVar48 * 4 + 2] = *(undefined1 *)((long)local_120 + lVar48 + lVar59);
          puVar63[lVar48 * 4 + 3] = *(undefined1 *)((long)local_120 + lVar48 + lVar54);
          lVar48 = lVar48 + 1;
        } while (uVar34 - uVar67 != (int)lVar48);
      }
      uVar31 = uVar31 + 1;
      pvVar69 = (void *)((long)pvVar69 + local_140);
      iVar51 = iVar51 + iVar42;
      iVar35 = iVar35 + iVar42;
      uVar52 = uVar52 + iVar42;
      iVar49 = iVar49 + iVar42;
    } while (uVar31 != local_90);
  }
  iVar42 = (int)local_c8;
  if (iVar42 != iVar36) {
    uVar31 = local_c8;
    do {
      uVar52 = (uint)uVar31;
      uVar67 = uVar52 + 3;
      if (-1 < (int)uVar52) {
        uVar67 = uVar52;
      }
      puVar63 = (undefined1 *)
                ((long)(int)(((int)uVar67 >> 2) + (uVar52 - (uVar67 & 0xfffffffc))) * local_140 +
                (long)pvVar60);
      puVar55 = (undefined1 *)((long)(int)(uVar34 * uVar52) + (long)local_120);
      if ((int)uVar34 < 2) {
        uVar52 = 0;
      }
      else {
        iVar51 = 1;
        do {
          *puVar63 = *puVar55;
          puVar63[1] = puVar55[1];
          puVar63 = puVar63 + 2;
          puVar55 = puVar55 + 2;
          iVar51 = iVar51 + 2;
          uVar52 = uVar34 & 0xfffffffe;
        } while (iVar51 < (int)uVar34);
      }
      if ((int)uVar52 < (int)uVar34) {
        lVar54 = 0;
        do {
          puVar63[lVar54] = puVar55[lVar54];
          lVar54 = lVar54 + 1;
        } while (uVar34 - uVar52 != (int)lVar54);
      }
      uVar31 = uVar31 + 1;
    } while ((long)uVar31 < (long)local_128);
  }
  if (0 < (int)uVar38) {
    local_38 = (scale_dequant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
    local_40 = local_98->data;
    local_48 = local_98->cstep * local_98->elemsize;
    lVar54 = uStack_e0 * CONCAT44(uStack_104,uStack_108);
    local_138 = local_118;
    uVar31 = 0;
    do {
      local_b8 = uVar31;
      uVar31 = local_b8 * 4;
      fVar92 = 0.0;
      fVar98 = 0.0;
      if (local_c0 != (void *)0x0) {
        fVar98 = *(float *)((long)local_c0 + local_b8 * 0x10);
        fVar92 = *(float *)((long)local_c0 + local_b8 * 0x10 + 4);
      }
      fVar93 = 0.0;
      fVar102 = 0.0;
      if (local_c0 != (void *)0x0) {
        fVar102 = *(float *)((long)local_c0 + local_b8 * 0x10 + 8);
        fVar93 = *(float *)((long)local_c0 + local_b8 * 0x10 + 0xc);
      }
      pfVar62 = (float *)(local_48 * uVar31 + (long)local_40);
      pfVar41 = (float *)((uVar31 | 1) * local_48 + (long)local_40);
      pfVar45 = (float *)((uVar31 | 2) * local_48 + (long)local_40);
      pfVar53 = (float *)((uVar31 | 3) * local_48 + (long)local_40);
      uVar31 = 0;
      fVar1 = local_38[local_b8 * 4];
      fVar2 = local_38[local_b8 * 4 + 1];
      fVar3 = local_38[local_b8 * 4 + 2];
      fVar4 = local_38[local_b8 * 4 + 3];
      if (3 < (int)uVar29) {
        pcVar64 = (char *)(local_140 * local_b8 + (long)pvVar60);
        local_120 = (void *)CONCAT44(local_120._4_4_,fVar92);
        local_b0 = CONCAT44(local_b0._4_4_,fVar102);
        uVar43 = 0;
        do {
          puVar33 = (ulong *)((uVar43 >> 2) * lVar54 + (long)local_118);
          local_158 = (undefined1  [16])0x0;
          local_68 = (undefined1  [16])0x0;
          local_78 = (undefined1  [16])0x0;
          local_88 = (undefined1  [16])0x0;
          pcVar57 = pcVar64;
          uVar52 = 0;
          if (1 < (int)uVar34) {
            local_68._0_4_ = 0;
            local_68._4_4_ = 0;
            local_68._8_4_ = 0;
            local_68._12_4_ = 0;
            local_78._0_4_ = 0;
            local_78._4_4_ = 0;
            local_78._8_4_ = 0;
            local_78._12_4_ = 0;
            iVar51 = 1;
            local_88._0_4_ = 0;
            local_88._4_4_ = 0;
            local_88._8_4_ = 0;
            local_88._12_4_ = 0;
            auVar107 = (undefined1  [16])0x0;
            do {
              iVar49 = (int)pcVar57[1];
              iVar35 = (int)*pcVar57;
              auVar118._4_4_ = iVar35;
              auVar118._0_4_ = iVar35;
              auVar118._8_4_ = iVar35;
              auVar118._12_4_ = iVar35;
              auVar83._8_8_ = 0;
              auVar83._0_8_ = *puVar33;
              auVar114 = psllw(auVar83,8);
              auVar115 = psraw(auVar114,8);
              auVar114 = pshuflw(ZEXT416((uint)(int)pcVar57[2]),ZEXT416((uint)(int)pcVar57[2]),0);
              sVar113 = auVar115._0_2_;
              sVar70 = auVar114._0_2_ * sVar113;
              sVar82 = auVar115._2_2_;
              sVar79 = auVar114._2_2_ * sVar82;
              sVar85 = auVar115._4_2_;
              sVar80 = auVar114._4_2_ * sVar85;
              sVar86 = auVar115._6_2_;
              sVar81 = auVar114._6_2_ * sVar86;
              auVar114 = pshuflw(ZEXT416((uint)(int)pcVar57[4]),ZEXT416((uint)(int)pcVar57[4]),0);
              sVar88 = auVar114._0_2_ * sVar113;
              sVar89 = auVar114._2_2_ * sVar82;
              sVar90 = auVar114._4_2_ * sVar85;
              sVar91 = auVar114._6_2_ * sVar86;
              auVar94 = pshuflw(ZEXT416((uint)(int)pcVar57[6]),ZEXT416((uint)(int)pcVar57[6]),0);
              sVar95 = auVar94._2_2_ * sVar82;
              sVar96 = auVar94._4_2_ * sVar85;
              sVar97 = auVar94._6_2_ * sVar86;
              auVar9._10_2_ = 0;
              auVar9._0_10_ = auVar115._0_10_;
              auVar9._12_2_ = sVar86;
              auVar13._8_2_ = sVar85;
              auVar13._0_8_ = auVar115._0_8_;
              auVar13._10_4_ = auVar9._10_4_;
              auVar21._6_8_ = 0;
              auVar21._0_6_ = auVar13._8_6_;
              auVar17._4_2_ = sVar82;
              auVar17._0_4_ = auVar115._0_4_;
              auVar17._6_8_ = SUB148(auVar21 << 0x40,6);
              auVar116._0_4_ = auVar115._0_4_ & 0xffff;
              auVar116._4_10_ = auVar17._4_10_;
              auVar116._14_2_ = 0;
              auVar117 = pmaddwd(auVar116,auVar118);
              auVar114 = psraw(auVar83,8);
              auVar119 = pshuflw(ZEXT416((uint)(int)pcVar57[3]),ZEXT416((uint)(int)pcVar57[3]),0);
              sVar82 = auVar114._0_2_;
              sVar85 = auVar114._2_2_;
              sVar86 = auVar114._4_2_;
              sVar87 = auVar114._6_2_;
              auVar115 = pshuflw(ZEXT416((uint)(int)pcVar57[5]),ZEXT416((uint)(int)pcVar57[5]),0);
              sVar99 = auVar115._6_2_ * sVar87;
              auVar100 = pshuflw(ZEXT416((uint)(int)pcVar57[7]),ZEXT416((uint)(int)pcVar57[7]),0);
              sVar101 = auVar100._6_2_ * sVar87;
              auVar10._10_2_ = 0;
              auVar10._0_10_ = auVar114._0_10_;
              auVar10._12_2_ = sVar87;
              auVar14._8_2_ = sVar86;
              auVar14._0_8_ = auVar114._0_8_;
              auVar14._10_4_ = auVar10._10_4_;
              auVar22._6_8_ = 0;
              auVar22._0_6_ = auVar14._8_6_;
              auVar18._4_2_ = sVar85;
              auVar18._0_4_ = auVar114._0_4_;
              auVar18._6_8_ = SUB148(auVar22 << 0x40,6);
              auVar84._0_4_ = auVar114._0_4_ & 0xffff;
              auVar84._4_10_ = auVar18._4_10_;
              auVar84._14_2_ = 0;
              auVar8._4_4_ = iVar49;
              auVar8._0_4_ = iVar49;
              auVar8._8_4_ = iVar49;
              auVar8._12_4_ = iVar49;
              auVar114 = pmaddwd(auVar84,auVar8);
              auVar109._0_4_ = auVar107._0_4_;
              local_158._0_4_ = auVar114._0_4_ + auVar109._0_4_ + auVar117._0_4_;
              local_158._4_4_ = auVar114._4_4_ + auVar107._4_4_ + auVar117._4_4_;
              local_158._8_4_ = auVar114._8_4_ + auVar107._8_4_ + auVar117._8_4_;
              local_158._12_4_ = auVar114._12_4_ + auVar107._12_4_ + auVar117._12_4_;
              auVar112._0_12_ = auVar107._0_12_;
              auVar112._12_2_ = auVar107._6_2_;
              auVar112._14_2_ = auVar119._6_2_ * sVar87;
              auVar111._12_4_ = auVar112._12_4_;
              auVar111._0_10_ = auVar107._0_10_;
              auVar111._10_2_ = auVar119._4_2_ * sVar86;
              auVar110._10_6_ = auVar111._10_6_;
              auVar110._0_8_ = auVar107._0_8_;
              auVar110._8_2_ = auVar107._4_2_;
              auVar109._8_8_ = auVar110._8_8_;
              auVar109._6_2_ = auVar119._2_2_ * sVar85;
              auVar109._4_2_ = auVar107._2_2_;
              Var28 = CONCAT64(CONCAT42(CONCAT22(sVar81,sVar81),sVar80),CONCAT22(sVar80,sVar81));
              auVar23._4_8_ = (long)((unkuint10)Var28 >> 0x10);
              auVar23._2_2_ = sVar79;
              auVar23._0_2_ = sVar79;
              auVar117._0_4_ = (int)sVar70;
              iVar35 = auVar23._0_4_ >> 0x10;
              auVar71._0_8_ = CONCAT44(iVar35,auVar117._0_4_);
              auVar71._8_4_ = (int)((unkuint10)Var28 >> 0x10) >> 0x10;
              local_68._0_4_ =
                   (int)(short)(auVar119._0_2_ * sVar82) + local_68._0_4_ + auVar117._0_4_;
              local_68._4_4_ = (auVar109._4_4_ >> 0x10) + local_68._4_4_ + iVar35;
              local_68._8_4_ = (auVar110._8_4_ >> 0x10) + local_68._8_4_ + auVar71._8_4_;
              local_68._12_4_ = (auVar111._12_4_ >> 0x10) + local_68._12_4_ + (int)sVar81;
              auVar74._12_2_ = sVar79 >> 0xf;
              auVar74._0_12_ = auVar71;
              auVar74._14_2_ = sVar91;
              auVar73._12_4_ = auVar74._12_4_;
              auVar73._0_10_ = auVar71._0_10_;
              auVar73._10_2_ = sVar90;
              auVar119._10_6_ = auVar73._10_6_;
              auVar119._8_2_ = sVar79;
              auVar119._0_8_ = auVar71._0_8_;
              auVar117._8_8_ = auVar119._8_8_;
              auVar117._6_2_ = sVar89;
              auVar117._4_2_ = sVar70 >> 0xf;
              auVar75._0_4_ = (int)sVar88;
              iVar35 = auVar117._4_4_ >> 0x10;
              auVar72._0_8_ = CONCAT44(iVar35,auVar75._0_4_);
              auVar72._8_4_ = auVar119._8_4_ >> 0x10;
              Var28 = CONCAT64(CONCAT42(CONCAT22(sVar99,sVar91),auVar115._4_2_ * sVar86),
                               CONCAT22(sVar90,sVar91));
              auVar24._4_8_ = (long)((unkuint10)Var28 >> 0x10);
              auVar24._2_2_ = auVar115._2_2_ * sVar85;
              auVar24._0_2_ = sVar89;
              local_78._0_4_ =
                   (int)(short)(auVar115._0_2_ * sVar82) + local_78._0_4_ + auVar75._0_4_;
              local_78._4_4_ = (auVar24._0_4_ >> 0x10) + local_78._4_4_ + iVar35;
              local_78._8_4_ =
                   ((int)((unkuint10)Var28 >> 0x10) >> 0x10) + local_78._8_4_ + auVar72._8_4_;
              local_78._12_4_ = (int)sVar99 + local_78._12_4_ + (auVar73._12_4_ >> 0x10);
              auVar78._12_2_ = sVar89 >> 0xf;
              auVar78._0_12_ = auVar72;
              auVar78._14_2_ = sVar97;
              auVar77._12_4_ = auVar78._12_4_;
              auVar77._0_10_ = auVar72._0_10_;
              auVar77._10_2_ = sVar96;
              auVar76._10_6_ = auVar77._10_6_;
              auVar76._8_2_ = sVar89;
              auVar76._0_8_ = auVar72._0_8_;
              auVar75._8_8_ = auVar76._8_8_;
              auVar75._6_2_ = sVar95;
              auVar75._4_2_ = sVar88 >> 0xf;
              Var28 = CONCAT64(CONCAT42(CONCAT22(sVar101,sVar97),auVar100._4_2_ * sVar86),
                               CONCAT22(sVar96,sVar97));
              auVar25._4_8_ = (long)((unkuint10)Var28 >> 0x10);
              auVar25._2_2_ = auVar100._2_2_ * sVar85;
              auVar25._0_2_ = sVar95;
              local_88._0_4_ =
                   (int)(short)(auVar100._0_2_ * sVar82) + local_88._0_4_ +
                   (int)(short)(auVar94._0_2_ * sVar113);
              local_88._4_4_ = (auVar25._0_4_ >> 0x10) + local_88._4_4_ + (auVar75._4_4_ >> 0x10);
              local_88._8_4_ =
                   ((int)((unkuint10)Var28 >> 0x10) >> 0x10) + local_88._8_4_ +
                   (auVar76._8_4_ >> 0x10);
              local_88._12_4_ = (int)sVar101 + local_88._12_4_ + (auVar77._12_4_ >> 0x10);
              pcVar57 = pcVar57 + 8;
              puVar33 = puVar33 + 1;
              iVar51 = iVar51 + 2;
              auVar107 = local_158;
              uVar52 = uVar34 & 0xfffffffe;
            } while (iVar51 < (int)uVar34);
          }
          if ((int)uVar52 < (int)uVar34) {
            do {
              lVar59 = 0;
              do {
                iVar51 = (int)*(char *)((long)puVar33 + lVar59);
                *(int *)(local_158 + lVar59 * 4) =
                     *(int *)(local_158 + lVar59 * 4) + *pcVar57 * iVar51;
                *(int *)(local_68 + lVar59 * 4) =
                     *(int *)(local_68 + lVar59 * 4) + pcVar57[1] * iVar51;
                *(int *)(local_78 + lVar59 * 4) =
                     *(int *)(local_78 + lVar59 * 4) + pcVar57[2] * iVar51;
                *(int *)(local_88 + lVar59 * 4) =
                     *(int *)(local_88 + lVar59 * 4) + pcVar57[3] * iVar51;
                lVar59 = lVar59 + 1;
              } while (lVar59 != 4);
              pcVar57 = pcVar57 + 4;
              puVar33 = (ulong *)((long)puVar33 + 4);
              uVar52 = uVar52 + 1;
            } while (uVar52 != uVar34);
          }
          lVar59 = 0;
          do {
            *(float *)((long)pfVar62 + lVar59) =
                 (float)*(int *)(local_158 + lVar59) * fVar1 + fVar98;
            *(float *)((long)pfVar41 + lVar59) = (float)*(int *)(local_68 + lVar59) * fVar2 + fVar92
            ;
            *(float *)((long)pfVar45 + lVar59) =
                 (float)*(int *)(local_78 + lVar59) * fVar3 + fVar102;
            *(float *)((long)pfVar53 + lVar59) = (float)*(int *)(local_88 + lVar59) * fVar4 + fVar93
            ;
            lVar59 = lVar59 + 4;
          } while (lVar59 != 0x10);
          pfVar62 = pfVar62 + 4;
          pfVar41 = pfVar41 + 4;
          pfVar45 = pfVar45 + 4;
          pfVar53 = pfVar53 + 4;
          uVar31 = uVar43 + 4;
          uVar61 = uVar43 + 7;
          uVar43 = uVar31;
          local_a8 = fVar2;
          local_a4 = fVar1;
        } while (uVar61 < uVar30);
      }
      if ((int)uVar31 < (int)uVar29) {
        pcVar64 = (char *)(local_140 * local_b8 + (long)pvVar60);
        do {
          pcVar65 = (char *)((ulong)(((uint)uVar31 & 3) + ((uint)(uVar31 >> 2) & 0x3fffffff)) *
                             lVar54 + (long)local_118);
          iVar51 = 0;
          pcVar57 = pcVar64;
          if ((int)uVar34 < 2) {
            iVar35 = 0;
            iVar49 = 0;
            iVar58 = 0;
            uVar52 = 0;
          }
          else {
            iVar58 = 0;
            iVar66 = 1;
            iVar49 = 0;
            iVar35 = 0;
            iVar51 = 0;
            do {
              iVar68 = (int)*pcVar65;
              iVar46 = (int)pcVar65[1];
              iVar51 = pcVar57[1] * iVar46 + *pcVar57 * iVar68 + iVar51;
              iVar35 = pcVar57[3] * iVar46 + pcVar57[2] * iVar68 + iVar35;
              iVar49 = pcVar57[5] * iVar46 + pcVar57[4] * iVar68 + iVar49;
              iVar58 = pcVar57[7] * iVar46 + pcVar57[6] * iVar68 + iVar58;
              pcVar57 = pcVar57 + 8;
              pcVar65 = pcVar65 + 2;
              iVar66 = iVar66 + 2;
              uVar52 = uVar34 & 0xfffffffe;
            } while (iVar66 < (int)uVar34);
          }
          if ((int)uVar52 < (int)uVar34) {
            lVar59 = 0;
            do {
              iVar66 = (int)pcVar65[lVar59];
              iVar51 = iVar51 + pcVar57[lVar59 * 4] * iVar66;
              iVar35 = iVar35 + pcVar57[lVar59 * 4 + 1] * iVar66;
              iVar49 = iVar49 + pcVar57[lVar59 * 4 + 2] * iVar66;
              iVar58 = iVar58 + pcVar57[lVar59 * 4 + 3] * iVar66;
              lVar59 = lVar59 + 1;
            } while (uVar34 - uVar52 != (int)lVar59);
          }
          *pfVar62 = (float)iVar51 * fVar1 + fVar98;
          *pfVar41 = (float)iVar35 * fVar2 + fVar92;
          *pfVar45 = (float)iVar49 * fVar3 + fVar102;
          *pfVar53 = (float)iVar58 * fVar4 + fVar93;
          pfVar62 = pfVar62 + 1;
          pfVar41 = pfVar41 + 1;
          pfVar45 = pfVar45 + 1;
          pfVar53 = pfVar53 + 1;
          uVar52 = (uint)uVar31 + 1;
          uVar31 = (ulong)uVar52;
        } while (uVar52 != uVar29);
      }
      uVar31 = local_b8 + 1;
    } while (local_b8 + 1 != local_90);
  }
  if (iVar42 != iVar36) {
    pvVar69 = local_98->data;
    sVar5 = local_98->cstep;
    sVar6 = local_98->elemsize;
    pfVar7 = (scale_dequant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar54 = uStack_e0 * CONCAT44(uStack_104,uStack_108);
    lVar59 = (long)iVar42;
    do {
      if (local_c0 == (void *)0x0) {
        fVar98 = 0.0;
      }
      else {
        fVar98 = *(float *)((long)local_c0 + lVar59 * 4);
      }
      pfVar41 = (float *)(sVar5 * sVar6 * lVar59 + (long)pvVar69);
      uVar31 = 0;
      fVar92 = pfVar7[lVar59];
      uVar52 = (uint)lVar59;
      if (3 < (int)uVar29) {
        uVar38 = uVar52 + 3;
        if (-1 < (int)uVar52) {
          uVar38 = uVar52;
        }
        pcVar64 = (char *)((long)(int)(((int)uVar38 >> 2) + (uVar52 - (uVar38 & 0xfffffffc))) *
                           local_140 + (long)pvVar60);
        uVar43 = 0;
        do {
          puVar33 = (ulong *)((uVar43 >> 2) * lVar54 + (long)local_118);
          local_158 = (undefined1  [16])0x0;
          pcVar57 = pcVar64;
          uVar38 = 0;
          if (1 < (int)uVar34) {
            iVar42 = 1;
            local_158._0_4_ = 0;
            local_158._4_4_ = 0;
            local_158._8_4_ = 0;
            local_158._12_4_ = 0;
            do {
              iVar51 = (int)pcVar57[1];
              iVar36 = (int)*pcVar57;
              auVar103._4_4_ = iVar36;
              auVar103._0_4_ = iVar36;
              auVar103._8_4_ = iVar36;
              auVar103._12_4_ = iVar36;
              auVar104._4_4_ = iVar51;
              auVar104._0_4_ = iVar51;
              auVar104._8_4_ = iVar51;
              auVar104._12_4_ = iVar51;
              auVar105._8_8_ = 0;
              auVar105._0_8_ = *puVar33;
              auVar107 = psllw(auVar105,8);
              auVar107 = psraw(auVar107,8);
              auVar11._10_2_ = 0;
              auVar11._0_10_ = auVar107._0_10_;
              auVar11._12_2_ = auVar107._6_2_;
              auVar15._8_2_ = auVar107._4_2_;
              auVar15._0_8_ = auVar107._0_8_;
              auVar15._10_4_ = auVar11._10_4_;
              auVar26._6_8_ = 0;
              auVar26._0_6_ = auVar15._8_6_;
              auVar19._4_2_ = auVar107._2_2_;
              auVar19._0_4_ = auVar107._0_4_;
              auVar19._6_8_ = SUB148(auVar26 << 0x40,6);
              auVar108._0_4_ = auVar107._0_4_ & 0xffff;
              auVar108._4_10_ = auVar19._4_10_;
              auVar108._14_2_ = 0;
              auVar114 = pmaddwd(auVar108,auVar103);
              auVar107 = psraw(auVar105,8);
              auVar12._10_2_ = 0;
              auVar12._0_10_ = auVar107._0_10_;
              auVar12._12_2_ = auVar107._6_2_;
              auVar16._8_2_ = auVar107._4_2_;
              auVar16._0_8_ = auVar107._0_8_;
              auVar16._10_4_ = auVar12._10_4_;
              auVar27._6_8_ = 0;
              auVar27._0_6_ = auVar16._8_6_;
              auVar20._4_2_ = auVar107._2_2_;
              auVar20._0_4_ = auVar107._0_4_;
              auVar20._6_8_ = SUB148(auVar27 << 0x40,6);
              auVar106._0_4_ = auVar107._0_4_ & 0xffff;
              auVar106._4_10_ = auVar20._4_10_;
              auVar106._14_2_ = 0;
              auVar107 = pmaddwd(auVar106,auVar104);
              local_158._0_4_ = auVar107._0_4_ + local_158._0_4_ + auVar114._0_4_;
              local_158._4_4_ = auVar107._4_4_ + local_158._4_4_ + auVar114._4_4_;
              local_158._8_4_ = auVar107._8_4_ + local_158._8_4_ + auVar114._8_4_;
              local_158._12_4_ = auVar107._12_4_ + local_158._12_4_ + auVar114._12_4_;
              pcVar57 = pcVar57 + 2;
              puVar33 = puVar33 + 1;
              iVar42 = iVar42 + 2;
              uVar38 = uVar34 & 0xfffffffe;
            } while (iVar42 < (int)uVar34);
          }
          if ((int)uVar38 < (int)uVar34) {
            do {
              lVar47 = 0;
              do {
                *(int *)(local_158 + lVar47 * 4) =
                     *(int *)(local_158 + lVar47 * 4) +
                     (int)*(char *)((long)puVar33 + lVar47) * (int)*pcVar57;
                lVar47 = lVar47 + 1;
              } while (lVar47 != 4);
              pcVar57 = pcVar57 + 1;
              puVar33 = (ulong *)((long)puVar33 + 4);
              uVar38 = uVar38 + 1;
            } while (uVar38 != uVar34);
          }
          *pfVar41 = (float)(int)local_158._0_4_ * fVar92 + fVar98;
          pfVar41[1] = (float)(int)local_158._4_4_ * fVar92 + fVar98;
          pfVar41[2] = (float)(int)local_158._8_4_ * fVar92 + fVar98;
          pfVar41[3] = (float)(int)local_158._12_4_ * fVar92 + fVar98;
          pfVar41 = pfVar41 + 4;
          uVar31 = uVar43 + 4;
          uVar61 = uVar43 + 7;
          uVar43 = uVar31;
        } while (uVar61 < uVar30);
      }
      if ((int)uVar31 < (int)uVar29) {
        uVar38 = uVar52 + 3;
        if (-1 < (int)uVar52) {
          uVar38 = uVar52;
        }
        do {
          if ((int)uVar34 < 1) {
            fVar93 = 0.0;
          }
          else {
            lVar47 = 0;
            iVar42 = 0;
            do {
              iVar42 = iVar42 + (int)*(char *)((long)local_118 +
                                              lVar47 + (ulong)(((uint)uVar31 & 3) +
                                                              ((uint)(uVar31 >> 2) & 0x3fffffff)) *
                                                       lVar54) *
                                (int)*(char *)((long)pvVar60 +
                                              lVar47 + (long)(int)(((int)uVar38 >> 2) +
                                                                  (uVar52 - (uVar38 & 0xfffffffc)))
                                                       * local_140);
              lVar47 = lVar47 + 1;
            } while (uVar34 != (uint)lVar47);
            fVar93 = (float)iVar42;
          }
          *pfVar41 = fVar93 * fVar92 + fVar98;
          pfVar41 = pfVar41 + 1;
          uVar67 = (uint)uVar31 + 1;
          uVar31 = (ulong)uVar67;
        } while (uVar67 != uVar29);
      }
      lVar59 = lVar59 + 1;
    } while (lVar59 < (long)local_128);
  }
  local_130 = uVar30;
  if (local_a0 != (int *)0x0) {
    LOCK();
    *local_a0 = *local_a0 + -1;
    UNLOCK();
    if (*local_a0 == 0) {
      if (local_50 == (Allocator *)0x0) {
        if (pvVar60 != (void *)0x0) {
          free(pvVar60);
        }
      }
      else {
        (**(code **)(*(long *)local_50 + 0x18))(local_50,pvVar60);
      }
    }
  }
  if (uStack_110 != (int *)0x0) {
    LOCK();
    *uStack_110 = *uStack_110 + -1;
    UNLOCK();
    if (*uStack_110 == 0) {
      if (local_f8 == (Allocator *)0x0) {
        if (local_118 != (void *)0x0) {
          free(local_118);
        }
      }
      else {
        (**(code **)(*(long *)local_f8 + 0x18))();
      }
    }
  }
  uStack_108 = 0;
  uStack_104 = 0;
  uStack_100 = 0;
  local_118 = (void *)0x0;
  uStack_110._0_4_ = 0;
  uStack_110._4_4_ = 0;
  auStack_f0 = (undefined1  [16])0x0;
  uStack_e0 = 0;
  if (local_d8 != (int *)0x0) {
    LOCK();
    *local_d8 = *local_d8 + -1;
    UNLOCK();
    if (*local_d8 == 0) {
      if (local_d0 == (Allocator *)0x0) {
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
      }
      else {
        (**(code **)(*(long *)local_d0 + 0x18))(local_d0,__ptr);
      }
    }
  }
  return;
}

Assistant:

static void conv_im2col_sgemm_int8_dequant_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, \
            const int kernel_w, const int kernel_h, const int stride_w, const int stride_h, const Mat &_bias, std::vector<float> scale_dequant, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char *kernel = _kernel;
    const float* bias = _bias;

    // im2row
    Mat bottom_im2row(kernel_h*kernel_w*inch, outw*outh, 1UL, opt.workspace_allocator);
    {
        signed char* ret = (signed char*)bottom_im2row;
        int retID = 0;
    
        for (int i=0; i<outh; i++)
        {
            for (int j=0; j<outw; j++)
            {
                for (int p=0; p<inch; p++)
                {
                    const signed char* input = bottom_blob.channel(p);
                    for (int u=0; u<kernel_h; u++)
                    {
                        for (int v=0; v<kernel_w; v++)
                        {    
                            int row = u + i * stride_h;
                            int col = v + j * stride_w;
                            int index = row * w + col;
                            ret[retID] = input[index];
                            retID++;
                        }
                    }                
                }
            }
        }
    }    

    int kernel_size = kernel_w * kernel_h;
    int out_size = outw * outh;

    // int M = outch;  // outch
    int N = outw * outh; // outsize or out stride
    int K = kernel_w * kernel_h * inch; // ksize * inch

    // bottom_im2row memory packed 4 x 4
    Mat bottom_tm(4*kernel_size, inch, out_size/4 + out_size%4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_size = out_size >> 2;
        int remain_size_start = nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii=0; ii<nn_size; ii++)
        {
            int i = ii * 4;

            const signed char* img0 = bottom_im2row.row<signed char>(i);
            const signed char* img1 = bottom_im2row.row<signed char>(i+1);
            const signed char* img2 = bottom_im2row.row<signed char>(i+2);
            const signed char* img3 = bottom_im2row.row<signed char>(i+3);

            signed char* tmpptr = bottom_tm.channel(i/4);

            int q = 0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];
                tmpptr[2] = img1[0];
                tmpptr[3] = img1[1];
                tmpptr[4] = img2[0];
                tmpptr[5] = img2[1];
                tmpptr[6] = img3[0];
                tmpptr[7] = img3[1];

                tmpptr += 8;
                img0 += 2;
                img1 += 2;
                img2 += 2;
                img3 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img1[0];
                tmpptr[2] = img2[0];
                tmpptr[3] = img3[0];

                tmpptr += 4;
                img0 += 1;
                img1 += 1;
                img2 += 1;
                img3 += 1;                
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_size_start; i<out_size; i++)
        {
            const signed char* img0 = bottom_im2row.row<signed char>(i);

            signed char* tmpptr = bottom_tm.channel(i/4 + i%4);

            int q=0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];

                tmpptr += 2;
                img0 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];

                tmpptr += 1;
                img0 += 1;
            }
        }       
    }

    // kernel memory packed 4 x 4
    Mat kernel_tm(4*kernel_size, inch, outch/4 + outch%4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int p = pp * 4;

            const signed char* k0 = kernel + (p+0)*inch*kernel_size;
            const signed char* k1 = kernel + (p+1)*inch*kernel_size;
            const signed char* k2 = kernel + (p+2)*inch*kernel_size;
            const signed char* k3 = kernel + (p+3)*inch*kernel_size;

            signed char* ktmp = kernel_tm.channel(p/4);

            int q=0;
            for (; q+1<inch*kernel_size; q+=2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp[2] = k1[0];
                ktmp[3] = k1[1];
                ktmp[4] = k2[0];
                ktmp[5] = k2[1];
                ktmp[6] = k3[0];
                ktmp[7] = k3[1];

                ktmp += 8;

                k0 += 2;
                k1 += 2;
                k2 += 2;
                k3 += 2;
            }

            for (; q<inch*kernel_size; q++)
            { 
                ktmp[0] = k0[0];
                ktmp[1] = k1[0];
                ktmp[2] = k2[0];
                ktmp[3] = k3[0];
                ktmp += 4;

                k0 += 1;
                k1 += 1;
                k2 += 1;
                k3 += 1;
            }           
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=remain_outch_start; p<outch; p++)
        {
            const signed char* k0 = kernel + (p+0)*inch*kernel_size;

            signed char* ktmp = kernel_tm.channel(p/4 + p%4);

            int q=0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp += 2;
                k0 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                ktmp[0] = k0[0];
                ktmp++;
                k0++;
            }
        }
    }    

    // 4x4
    // sgemm(int M, int N, int K, float* A, float* B, float* C)
    {
        // int M = outch;  // outch
        // int N = outw * outh; // outsize or out stride
        // int L = kernel_w * kernel_h * inch; // ksize * inch

        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int i = pp * 4;

            const float bias0 = bias ? bias[i] : 0.f;
            const float bias1 = bias ? bias[i+1] : 0.f;
            const float bias2 = bias ? bias[i+2] : 0.f;
            const float bias3 = bias ? bias[i+3] : 0.f;

            const float scale_dequant0 = scale_dequant[i];
            const float scale_dequant1 = scale_dequant[i+1];
            const float scale_dequant2 = scale_dequant[i+2];
            const float scale_dequant3 = scale_dequant[i+3];

            float* output0 = top_blob.channel(i);
            float* output1 = top_blob.channel(i+1);
            float* output2 = top_blob.channel(i+2);
            float* output3 = top_blob.channel(i+3);

            int j=0;
            for (; j+3<N; j=j+4)
            {
                signed char* vb = bottom_tm.channel(j/4);
                signed char* va = kernel_tm.channel(i/4);
                
                int sum0[4] = {0};
                int sum1[4] = {0};
                int sum2[4] = {0};
                int sum3[4] = {0};
               
                int k=0;

                for (; k+1<K; k=k+2)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[2*n];   // k0
                        sum0[n] += (int)va[1] * vb[2*n+1];

                        sum1[n] += (int)va[2] * vb[2*n];   // k1
                        sum1[n] += (int)va[3] * vb[2*n+1];

                        sum2[n] += (int)va[4] * vb[2*n];   // k2
                        sum2[n] += (int)va[5] * vb[2*n+1];

                        sum3[n] += (int)va[6] * vb[2*n];   // k3
                        sum3[n] += (int)va[7] * vb[2*n+1];
                    }

                    va += 8;
                    vb += 8;
                }

                for (; k<K; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[n];
                        sum1[n] += (int)va[1] * vb[n];
                        sum2[n] += (int)va[2] * vb[n];
                        sum3[n] += (int)va[3] * vb[n];
                    }
                    
                    va += 4;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output0[n] = (float)sum0[n] * scale_dequant0 + bias0;
                    output1[n] = (float)sum1[n] * scale_dequant1 + bias1;
                    output2[n] = (float)sum2[n] * scale_dequant2 + bias2;
                    output3[n] = (float)sum3[n] * scale_dequant3 + bias3;
                }
                output0 += 4;
                output1 += 4;
                output2 += 4;
                output3 += 4;
            }

            for (; j<N; j++)
            {                
                int sum0 = 0;
                int sum1 = 0;
                int sum2 = 0;
                int sum3 = 0;

                signed char* vb = bottom_tm.channel(j/4 + j%4);
                signed char* va = kernel_tm.channel(i/4);

                int k=0;

                for (; k+1<K; k=k+2)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum0 += (int)va[1] * vb[1];

                    sum1 += (int)va[2] * vb[0];
                    sum1 += (int)va[3] * vb[1];

                    sum2 += (int)va[4] * vb[0];
                    sum2 += (int)va[5] * vb[1];

                    sum3 += (int)va[6] * vb[0];
                    sum3 += (int)va[7] * vb[1];

                    va += 8;
                    vb += 2;
                }

                for (; k<K; k++)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum1 += (int)va[1] * vb[0];
                    sum2 += (int)va[2] * vb[0];
                    sum3 += (int)va[3] * vb[0];

                    va += 4;
                    vb += 1;
                }
                
                output0[0] = (float)sum0 * scale_dequant0 + bias0;
                output1[0] = (float)sum1 * scale_dequant1 + bias1;
                output2[0] = (float)sum2 * scale_dequant2 + bias2;
                output3[0] = (float)sum3 * scale_dequant3 + bias3;

                output0++;
                output1++;
                output2++;
                output3++;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_outch_start; i<outch; i++)
        {
            float* output = top_blob.channel(i);

            const float bias0 = bias ? bias[i] : 0.f;
            const float scale_dequant0 = scale_dequant[i];            

            int j=0;
            for (; j+3<N; j=j+4)
            {
                signed char* vb = bottom_tm.channel(j/4);
                signed char* va = kernel_tm.channel(i/4 + i%4);
                int sum[4] = {0};

                int k=0;
                for (; k+1<K; k=k+2)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += (int)va[0] * vb[2*n];
                        sum[n] += (int)va[1] * vb[2*n+1];
                    }
                    va += 2;
                    vb += 8;
                }

                for (; k<K; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += (int)va[0] * vb[n];
                    }
                    va += 1;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output[n] = (float)sum[n] * scale_dequant0 + bias0;
                }
                output += 4;
            }

            for (; j<N; j++)
            {
                int sum = 0;

                signed char* vb = bottom_tm.channel(j/4 + j%4);
                signed char* va = kernel_tm.channel(i/4 + i%4);

                for (int k=0; k<K; k++)
                {
                    sum += (int)va[0] * vb[0];

                    va += 1;
                    vb += 1;
                }
                output[0] = (float)sum * scale_dequant0 + bias0;

                output++;
            }
        }
    }

    // // sgemm(int M, int N, int K, float* A, float* B, float* C)
    // {
    //     for (int i=0; i<M; i++)
    //     {
    //         int* output = top_blob.channel(i);

    //         for (int j=0; j<N; j++)
    //         {
    //             int sum = 0;

    //             signed char* vb = (signed char*)bottom_im2row + K * j;
    //             const signed char* va = kernel + K * i;

    //             for (int k=0; k<K; k++)
    //             {
    //                 sum += (int)va[0] * vb[0];

    //                 va += 1;
    //                 vb += 1;
    //             }
    //             output[0] = sum;

    //             output++;
    //         }
    //     }
    // }
}